

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funchook_x86.c
# Opt level: O0

int funchook_fix_code(funchook_t *funchook,funchook_entry_t *entry,ip_displacement_t *disp)

{
  int iVar1;
  uint8_t *in_RDX;
  funchook_t *in_RSI;
  uint32_t *offset_addr;
  insn_t *src_addr;
  uint8_t *in_stack_ffffffffffffffd8;
  funchook_t *in_stack_ffffffffffffffe0;
  
  iVar1 = funchook_jump32_avail((uint8_t *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (iVar1 == 0) {
    funchook_write_jump32
              (in_RSI,in_RDX,(uint8_t *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    funchook_write_jump64(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(uint8_t *)0x10266d);
  }
  else {
    funchook_write_jump32
              (in_RSI,in_RDX,(uint8_t *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    in_RSI->error_message[0x23] = '\0';
  }
  *(int *)(in_RSI->error_message + *(long *)(in_RDX + 0x10)) =
       (int)*(undefined8 *)in_RDX - ((int)in_RSI + 0x10 + (int)*(undefined8 *)(in_RDX + 8));
  if (*(long *)(in_RDX + 0x18) != 0) {
    *(int *)(in_RSI->error_message + *(long *)(in_RDX + 0x28)) =
         (int)*(undefined8 *)(in_RDX + 0x18) -
         ((int)in_RSI + 0x10 + (int)*(undefined8 *)(in_RDX + 0x20));
  }
  return 0;
}

Assistant:

int funchook_fix_code(funchook_t *funchook, funchook_entry_t *entry, const ip_displacement_t *disp)
{
    insn_t *src_addr;
    uint32_t *offset_addr;

#ifdef CPU_X86_64
    if (funchook_jump32_avail(entry->target_func, entry->hook_func)) {
        funchook_write_jump32(funchook, entry->target_func, entry->hook_func, entry->new_code);
        entry->transit[0] = 0;
    } else {
        funchook_write_jump32(funchook, entry->target_func, entry->transit, entry->new_code);
        funchook_write_jump64(funchook, entry->transit, entry->hook_func);
    }
#else
    funchook_write_jump32(funchook, entry->target_func, entry->hook_func, entry->new_code);
#endif
    /* fix rip-relative offsets */
    src_addr = entry->trampoline + disp->disp[0].src_addr_offset;
    offset_addr = (uint32_t*)(entry->trampoline + disp->disp[0].pos_offset);
    *offset_addr = (uint32_t)(disp->disp[0].dst_addr - src_addr);
    if (disp->disp[1].dst_addr != 0) {
        src_addr = entry->trampoline + disp->disp[1].src_addr_offset;
        offset_addr = (uint32_t*)(entry->trampoline + disp->disp[1].pos_offset);
        *offset_addr = (uint32_t)(disp->disp[1].dst_addr - src_addr);
    }
    return 0;
}